

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
::~sherwood_v3_table
          (sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
           *this)

{
  char max_lookups;
  EntryPointer begin;
  size_t num_slots_minus_one;
  long lVar1;
  
  begin = this->entries;
  num_slots_minus_one = this->num_slots_minus_one;
  max_lookups = this->max_lookups;
  if (begin != begin + num_slots_minus_one + (long)max_lookups) {
    lVar1 = 0;
    do {
      if (-1 < (&begin->distance_from_desired)[lVar1]) {
        (&begin->distance_from_desired)[lVar1] = -1;
      }
      lVar1 = lVar1 + 0x18;
    } while ((long)max_lookups * 0x18 + num_slots_minus_one * 0x18 != lVar1);
  }
  this->num_elements = 0;
  deallocate_data(this,begin,num_slots_minus_one,max_lookups);
  return;
}

Assistant:

~sherwood_v3_table()
    {
        clear();
        deallocate_data(entries, num_slots_minus_one, max_lookups);
    }